

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int incrVacuumStep(BtShared *pBt,Pgno nFin,Pgno iLastPg,int bCommit)

{
  MemPage *pMVar1;
  u8 eType_00;
  Pgno PVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  undefined8 uVar6;
  uint uVar7;
  long in_FS_OFFSET;
  Pgno iFreePg;
  Pgno iFreePg_1;
  MemPage *pFreePg;
  Pgno iPtrPage;
  u8 eType;
  MemPage *local_58;
  Pgno local_4c;
  MemPage *local_48;
  Pgno local_40;
  u8 local_39;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  PVar2 = 0;
  if (1 < iLastPg) {
    iVar5 = (iLastPg - 2) - (iLastPg - 2) % (pBt->usableSize / 5 + 1);
    PVar2 = iVar5 + (uint)(iVar5 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
  }
  if ((PVar2 != iLastPg) && ((uint)sqlite3PendingByte / pBt->pageSize + 1 != iLastPg)) {
    local_39 = 0xaa;
    local_40 = 0xaaaaaaaa;
    uVar3 = *(uint *)(pBt->pPage1->aData + 0x24);
    if (((uVar3 >> 0x18 == 0 && (uVar3 & 0xff0000) == 0) && (uVar3 & 0xff00) == 0) &&
        (uVar3 & 0xff) == 0) {
      iVar5 = 0x65;
      goto LAB_0013f977;
    }
    iVar5 = ptrmapGet(pBt,iLastPg,&local_39,&local_40);
    eType_00 = local_39;
    if (iVar5 != 0) goto LAB_0013f977;
    if (local_39 == '\x02') {
      if (bCommit == 0) {
        local_58 = (MemPage *)CONCAT44(local_58._4_4_,0xaaaaaaaa);
        local_48 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        iVar5 = allocateBtreePage(pBt,&local_48,(Pgno *)&local_58,iLastPg,'\x01');
        if (iVar5 != 0) goto LAB_0013f977;
        if (local_48 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_48->pDbPage);
        }
      }
    }
    else {
      if (local_39 == '\x01') {
        uVar6 = 0x1242a;
LAB_0013f968:
        iVar5 = 0xb;
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar6,
                    "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
        goto LAB_0013f977;
      }
      local_4c = 0xaaaaaaaa;
      local_48 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
      iVar5 = btreeGetPage(pBt,iLastPg,&local_48,0);
      if (iVar5 != 0) goto LAB_0013f977;
      PVar2 = 0;
      if (bCommit == 0) {
        PVar2 = nFin;
      }
      do {
        local_58 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        uVar3 = pBt->nPage;
        iVar5 = allocateBtreePage(pBt,&local_58,&local_4c,PVar2,(bCommit == 0) * '\x02');
        if (iVar5 != 0) {
          if (local_48 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_48->pDbPage);
          }
          goto LAB_0013f977;
        }
        if (local_58 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_58->pDbPage);
        }
        pMVar1 = local_48;
        if (uVar3 < local_4c) {
          if (local_48 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(local_48->pDbPage);
          }
          uVar6 = 0x1245e;
          goto LAB_0013f968;
        }
      } while ((bCommit != 0) && (nFin < local_4c));
      iVar5 = relocatePage(pBt,local_48,eType_00,local_40,local_4c,bCommit);
      if (pMVar1 != (MemPage *)0x0) {
        sqlite3PagerUnrefNotNull(pMVar1->pDbPage);
      }
      if (iVar5 != 0) goto LAB_0013f977;
    }
  }
  iVar5 = 0;
  if (bCommit == 0) {
    uVar3 = (uint)sqlite3PendingByte / pBt->pageSize;
    uVar7 = iLastPg - 1;
    do {
      if ((-2 - uVar3) + uVar7 != -1) {
        uVar4 = 0;
        if (1 < uVar7) {
          iVar5 = (uVar7 - 2) - (uVar7 - 2) % (pBt->usableSize / 5 + 1);
          uVar4 = iVar5 + (uint)(iVar5 + 1U == uVar3) + 2;
        }
        if (uVar7 != uVar4) goto LAB_0013f8e3;
      }
      uVar7 = uVar7 - 1;
    } while( true );
  }
LAB_0013f977:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
LAB_0013f8e3:
  pBt->bDoTruncate = '\x01';
  pBt->nPage = uVar7;
  iVar5 = 0;
  goto LAB_0013f977;
}

Assistant:

static int incrVacuumStep(BtShared *pBt, Pgno nFin, Pgno iLastPg, int bCommit){
  Pgno nFreeList;           /* Number of pages still on the free-list */
  int rc;

  assert( sqlite3_mutex_held(pBt->mutex) );
  assert( iLastPg>nFin );

  if( !PTRMAP_ISPAGE(pBt, iLastPg) && iLastPg!=PENDING_BYTE_PAGE(pBt) ){
    u8 eType;
    Pgno iPtrPage;

    nFreeList = get4byte(&pBt->pPage1->aData[36]);
    if( nFreeList==0 ){
      return SQLITE_DONE;
    }

    rc = ptrmapGet(pBt, iLastPg, &eType, &iPtrPage);
    if( rc!=SQLITE_OK ){
      return rc;
    }
    if( eType==PTRMAP_ROOTPAGE ){
      return SQLITE_CORRUPT_BKPT;
    }

    if( eType==PTRMAP_FREEPAGE ){
      if( bCommit==0 ){
        /* Remove the page from the files free-list. This is not required
        ** if bCommit is non-zero. In that case, the free-list will be
        ** truncated to zero after this function returns, so it doesn't
        ** matter if it still contains some garbage entries.
        */
        Pgno iFreePg;
        MemPage *pFreePg;
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iLastPg, BTALLOC_EXACT);
        if( rc!=SQLITE_OK ){
          return rc;
        }
        assert( iFreePg==iLastPg );
        releasePage(pFreePg);
      }
    } else {
      Pgno iFreePg;             /* Index of free page to move pLastPg to */
      MemPage *pLastPg;
      u8 eMode = BTALLOC_ANY;   /* Mode parameter for allocateBtreePage() */
      Pgno iNear = 0;           /* nearby parameter for allocateBtreePage() */

      rc = btreeGetPage(pBt, iLastPg, &pLastPg, 0);
      if( rc!=SQLITE_OK ){
        return rc;
      }

      /* If bCommit is zero, this loop runs exactly once and page pLastPg
      ** is swapped with the first free page pulled off the free list.
      **
      ** On the other hand, if bCommit is greater than zero, then keep
      ** looping until a free-page located within the first nFin pages
      ** of the file is found.
      */
      if( bCommit==0 ){
        eMode = BTALLOC_LE;
        iNear = nFin;
      }
      do {
        MemPage *pFreePg;
        Pgno dbSize = btreePagecount(pBt);
        rc = allocateBtreePage(pBt, &pFreePg, &iFreePg, iNear, eMode);
        if( rc!=SQLITE_OK ){
          releasePage(pLastPg);
          return rc;
        }
        releasePage(pFreePg);
        if( iFreePg>dbSize ){
          releasePage(pLastPg);
          return SQLITE_CORRUPT_BKPT;
        }
      }while( bCommit && iFreePg>nFin );
      assert( iFreePg<iLastPg );

      rc = relocatePage(pBt, pLastPg, eType, iPtrPage, iFreePg, bCommit);
      releasePage(pLastPg);
      if( rc!=SQLITE_OK ){
        return rc;
      }
    }
  }

  if( bCommit==0 ){
    do {
      iLastPg--;
    }while( iLastPg==PENDING_BYTE_PAGE(pBt) || PTRMAP_ISPAGE(pBt, iLastPg) );
    pBt->bDoTruncate = 1;
    pBt->nPage = iLastPg;
  }
  return SQLITE_OK;
}